

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio_strings.hpp
# Opt level: O0

Elf_Word __thiscall
ELFIO::string_section_accessor_template<ELFIO::section>::add_string
          (string_section_accessor_template<ELFIO::section> *this,char *str)

{
  uint uVar1;
  uint uVar2;
  size_t sVar3;
  Elf_Word append_size;
  size_t str_len;
  char empty_string;
  char *pcStack_20;
  Elf_Word current_position;
  char *str_local;
  string_section_accessor_template<ELFIO::section> *this_local;
  
  if (str == (char *)0x0) {
    return 0;
  }
  str_len._4_4_ = 0;
  if (this->string_section != (section *)0x0) {
    pcStack_20 = str;
    str_local = (char *)this;
    str_len._4_4_ = (*this->string_section->_vptr_section[0x13])();
    if (str_len._4_4_ == 0) {
      str_len._3_1_ = 0;
      (*this->string_section->_vptr_section[0x1c])(this->string_section,(long)&str_len + 3,1);
      str_len._4_4_ = str_len._4_4_ + 1;
    }
    sVar3 = strlen(pcStack_20);
    uVar1 = std::numeric_limits<unsigned_int>::max();
    if (uVar1 - 1 < sVar3) {
      return 0;
    }
    uVar1 = (int)sVar3 + 1;
    uVar2 = std::numeric_limits<unsigned_int>::max();
    if (uVar2 - str_len._4_4_ < uVar1) {
      return 0;
    }
    (*this->string_section->_vptr_section[0x1c])(this->string_section,pcStack_20,(ulong)uVar1);
  }
  return str_len._4_4_;
}

Assistant:

Elf_Word add_string( const char* str )
    {
        if ( !str ) {
            return 0; // Return index of empty string for null input
        }

        Elf_Word current_position = 0;

        if ( string_section ) {
            // Strings are added to the end of the current section data
            current_position =
                static_cast<Elf_Word>( string_section->get_size() );

            if ( current_position == 0 ) {
                char empty_string = '\0';
                string_section->append_data( &empty_string, 1 );
                current_position++;
            }

            // Calculate string length and check for overflow
            size_t str_len = std::strlen( str );
            if ( str_len > std::numeric_limits<Elf_Word>::max() - 1 ) {
                return 0; // String too long
            }

            // Check if appending would overflow section size
            Elf_Word append_size = static_cast<Elf_Word>( str_len + 1 );
            if ( append_size >
                 std::numeric_limits<Elf_Word>::max() - current_position ) {
                return 0; // Would overflow section size
            }

            string_section->append_data( str, append_size );
        }

        return current_position;
    }